

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

Vec4 __thiscall tcu::astc::getBlockTestTypeColorScale(astc *this,BlockTestType testType)

{
  float s;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar1;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar2;
  undefined8 in_XMM1_Qa;
  Vec4 VVar3;
  
  if (testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15) {
    s = 1.5266243e-05;
  }
  else {
    if (testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15) {
      uVar1 = 0x37801002;
      uVar2 = 0x37801002;
      *(undefined4 *)this = 0x37801002;
      *(undefined4 *)(this + 4) = 0x37801002;
      *(undefined4 *)(this + 8) = 0x37801002;
      *(undefined4 *)(this + 0xc) = 0x3f800000;
      goto LAB_00313fe4;
    }
    if (testType == BLOCK_TEST_TYPE_VOID_EXTENT_HDR) {
      s = 7.633122e-06;
    }
    else {
      s = 1.0;
    }
  }
  Vector<float,_4>::Vector((Vector<float,_4> *)this,s);
  uVar1 = extraout_XMM0_Da;
  uVar2 = extraout_XMM0_Db;
LAB_00313fe4:
  VVar3.m_data[1] = (float)uVar2;
  VVar3.m_data[0] = (float)uVar1;
  VVar3.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar3.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  return (Vec4)VVar3.m_data;
}

Assistant:

Vec4 getBlockTestTypeColorScale (BlockTestType testType)
{
	switch (testType)
	{
		case tcu::astc::BLOCK_TEST_TYPE_VOID_EXTENT_HDR:			return Vec4(0.5f/65504.0f);
		case tcu::astc::BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:	return Vec4(1.0f/65504.0f, 1.0f/65504.0f, 1.0f/65504.0f, 1.0f);
		case tcu::astc::BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:		return Vec4(1.0f/65504.0f);
		default:													return Vec4(1.0f);
	}
}